

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_791d::TENSOR_INITIALIZING_2_Test::TestBody(TENSOR_INITIALIZING_2_Test *this)

{
  void *pvVar1;
  bool bVar2;
  int *piVar3;
  long lVar4;
  char *pcVar5;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  AssertionResult gtest_ar;
  tensor<int,_2U> ts;
  array<unsigned_int,_2UL> local_b8;
  undefined4 local_b0;
  AssertHelper local_a8;
  undefined4 local_a0;
  allocator_type local_9b;
  allocator_type local_9a;
  allocator_type local_99;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  tensor<int,_2U> local_50;
  
  local_b8._M_elems = (_Type)&DAT_200000001;
  local_b0 = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l,&local_99);
  local_a8.data_ = (AssertHelperData *)0x500000004;
  local_a0 = 6;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l_00,&local_9a);
  __l_01._M_len = 2;
  __l_01._M_array = &local_98;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_68,__l_01,&local_9b);
  dnet::data_types::tensor<int,_2U>::tensor
            (&local_50,&local_68,(array<unsigned_int,_2UL>)0x300000002);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_68);
  lVar4 = 0x18;
  do {
    pvVar1 = *(void **)((long)&local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_b8._M_elems[0] = 0;
  local_b8._M_elems[1] = 0;
  piVar3 = dnet::data_types::tensor<int,_2U>::operator[](&local_50,&local_b8);
  local_a8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_98,"(ts[{0,0}])","1",piVar3,(int *)&local_a8);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x5d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_b8._M_elems != (_Type)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_b8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_b8._M_elems + 8))();
      }
      local_b8._M_elems[0] = 0;
      local_b8._M_elems[1] = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._M_elems[0] = 0;
  local_b8._M_elems[1] = 2;
  piVar3 = dnet::data_types::tensor<int,_2U>::operator[](&local_50,&local_b8);
  local_a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_98,"(ts[{0,2}])","3",piVar3,(int *)&local_a8);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x5e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_b8._M_elems != (_Type)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_b8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_b8._M_elems + 8))();
      }
      local_b8._M_elems[0] = 0;
      local_b8._M_elems[1] = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._M_elems = (_Type)&DAT_100000001;
  piVar3 = dnet::data_types::tensor<int,_2U>::operator[](&local_50,&local_b8);
  local_a8.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_98,"(ts[{1,1}])","5",piVar3,(int *)&local_a8);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x5f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_b8._M_elems != (_Type)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_b8._M_elems != (_Type)0x0)) {
        (**(code **)(*(long *)local_b8._M_elems + 8))();
      }
      local_b8._M_elems[0] = 0;
      local_b8._M_elems[1] = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(TENSOR, INITIALIZING_2) {
        tensor<int, 2> ts({
                                  {1,2,3},
                                  {4,5,6}
                          }, {2,3});
        EXPECT_EQ((ts[{0,0}]), 1);
        EXPECT_EQ((ts[{0,2}]), 3);
        EXPECT_EQ((ts[{1,1}]), 5);
    }